

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O1

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const>const>const>const>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,
               MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>_>_>
               *src,assign_op<double,_double> *func)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  NestedExpressionType pMVar5;
  double *pdVar6;
  ulong cols;
  ulong uVar7;
  double *pdVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 *puVar11;
  long lVar12;
  Index index;
  ulong uVar13;
  long lVar14;
  double dVar15;
  double dVar19;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  
  dVar2 = (src->m_expression).m_lhs.m_functor.m_other;
  dVar3 = (src->m_expression).m_rhs.m_lhs.m_functor.m_other;
  dVar4 = (src->m_expression).m_rhs.m_rhs.m_xpr.m_lhs.m_functor.m_other;
  pMVar5 = (src->m_expression).m_rhs.m_rhs.m_xpr.m_rhs.m_expression;
  pdVar6 = (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data;
  uVar13 = (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_rows;
  cols = (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
  ;
  if (((dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows !=
       uVar13) ||
     ((dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols !=
      cols)) {
    if ((long)(cols | uVar13) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/m-iDev-0792[P]HJNN/include/Eigen/src/Core/PlainObjectBase.h"
                    ,0x11d,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((cols != 0 && uVar13 != 0) &&
       (auVar21 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar21 / SEXT816((long)cols),0) < (long)uVar13)) {
      puVar11 = (undefined8 *)
                __cxa_allocate_exception(8,src,SUB168(auVar21 % SEXT816((long)cols),0));
      *puVar11 = std::random_device::_M_fini;
      __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)dst,cols * uVar13,uVar13,cols);
  }
  uVar7 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  if ((uVar7 == uVar13) &&
     (uVar13 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_cols, uVar13 == cols)) {
    pdVar8 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    lVar14 = uVar13 * uVar7;
    uVar13 = lVar14 - (lVar14 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < lVar14) {
      lVar12 = 0;
      do {
        pdVar1 = pdVar6 + lVar12;
        dVar28 = *pdVar1;
        dVar29 = pdVar1[1];
        if (pexp<double__vector(2)>(double(int)const)::p4i_1023_0 == '\0') {
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const>const>const>const>,Eigen::internal::assign_op<double,double>>
                    ();
        }
        dVar28 = dVar28 * dVar4;
        dVar29 = dVar29 * dVar4;
        auVar20._8_8_ = dVar29;
        auVar20._0_8_ = dVar28;
        auVar21 = minpd(auVar20,_DAT_00114070);
        auVar10._8_8_ = 0xc0862b7d369a5715;
        auVar10._0_8_ = 0xc0862b7d369a5715;
        auVar21 = maxpd(auVar21,auVar10);
        dVar24 = auVar21._0_8_ * 1.4426950408889634 + 0.5;
        dVar25 = auVar21._8_8_ * 1.4426950408889634 + 0.5;
        dVar15 = (double)(int)dVar24;
        dVar19 = (double)(int)dVar25;
        dVar15 = dVar15 - (double)(-(ulong)(dVar24 < dVar15) & 0x3ff0000000000000);
        dVar19 = dVar19 - (double)(-(ulong)(dVar25 < dVar19) & 0x3ff0000000000000);
        dVar26 = dVar15 * -0.693145751953125 + auVar21._0_8_ + dVar15 * -1.4286068203094173e-06;
        dVar27 = dVar19 * -0.693145751953125 + auVar21._8_8_ + dVar19 * -1.4286068203094173e-06;
        dVar24 = dVar26 * dVar26;
        dVar25 = dVar27 * dVar27;
        auVar22._0_8_ =
             ((dVar24 * 0.00012617719307481058 + 0.030299440770744195) * dVar24 + 1.0) * dVar26;
        auVar22._8_8_ =
             ((dVar25 * 0.00012617719307481058 + 0.030299440770744195) * dVar25 + 1.0) * dVar27;
        auVar21._8_8_ =
             (((dVar25 * 3.0019850513866446e-06 + 0.002524483403496841) * dVar25 +
              0.22726554820815503) * dVar25 + 2.0) - auVar22._8_8_;
        auVar21._0_8_ =
             (((dVar24 * 3.0019850513866446e-06 + 0.002524483403496841) * dVar24 +
              0.22726554820815503) * dVar24 + 2.0) - auVar22._0_8_;
        auVar21 = divpd(auVar22,auVar21);
        auVar16._0_8_ =
             (double)CONCAT44(((int)dVar15 + pexp<double__vector(2)>(double(int)const)::p4i_1023_0)
                              * 0x100000,DAT_001222ec << 0x14);
        auVar16._8_4_ = DAT_001222e8 << 0x14;
        auVar16._12_4_ = ((int)dVar19 + DAT_001222e4) * 0x100000;
        auVar17._0_8_ = auVar16._0_8_ * (auVar21._0_8_ + auVar21._0_8_ + 1.0);
        auVar17._8_8_ = auVar16._8_8_ * (auVar21._8_8_ + auVar21._8_8_ + 1.0);
        auVar9._8_8_ = dVar29;
        auVar9._0_8_ = dVar28;
        auVar21 = maxpd(auVar17,auVar9);
        auVar18._0_8_ = auVar21._0_8_ + dVar3;
        auVar18._8_8_ = auVar21._8_8_ + dVar3;
        auVar23._8_8_ = dVar2;
        auVar23._0_8_ = dVar2;
        auVar21 = divpd(auVar23,auVar18);
        *(undefined1 (*) [16])(pdVar8 + lVar12) = auVar21;
        lVar12 = lVar12 + 2;
      } while (lVar12 < (long)uVar13);
    }
    if ((long)uVar13 < lVar14) {
      do {
        dVar28 = exp(pdVar6[uVar13] * dVar4);
        pdVar8[uVar13] = dVar2 / (dVar28 + dVar3);
        uVar13 = uVar13 + 1;
      } while (lVar14 - uVar13 != 0);
    }
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/workspace/llm4binary/github/license_all_cmakelists_25/m-iDev-0792[P]HJNN/include/Eigen/src/Core/AssignEvaluator.h"
                ,0x2d1,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, -1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, -1>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, -1>>, const Eigen::ArrayWrapper<const Eigen::Matrix<double, -1, -1>>>>>>>, T1 = double, T2 = double]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);
    
  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}